

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

bool absl::lts_20250127::Cord::GetFlatAux
               (Nonnull<CordRep_*> rep,Nonnull<absl::string_view_*> fragment)

{
  CordRep *pCVar1;
  byte bVar2;
  bool bVar3;
  uint8_t *puVar4;
  CordRepBtree *this;
  size_t sVar5;
  
  if (rep == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x57a,
                  "static bool absl::Cord::GetFlatAux(absl::Nonnull<CordRep *>, absl::Nonnull<absl::string_view *>)"
                 );
  }
  if (rep->length == 0) {
    fragment->_M_len = 0;
    fragment->_M_str = (char *)0x0;
  }
  else {
    if (rep->tag == '\x02') {
      rep = (Nonnull<CordRep_*>)rep[1].length;
    }
    bVar2 = (((CordRepBtree *)rep)->super_CordRep).tag;
    if (bVar2 < 6) {
      if (bVar2 == 1) {
        this = (CordRepBtree *)((CordRepBtree *)rep)->edges_[1];
        bVar2 = (this->super_CordRep).tag;
        if (bVar2 < 6) {
          if (bVar2 == 3) {
            bVar3 = cord_internal::CordRepBtree::IsFlat
                              (this,(size_t)((CordRepBtree *)rep)->edges_[0],
                               (((CordRepBtree *)rep)->super_CordRep).length,fragment);
            this = (CordRepBtree *)(ulong)bVar3;
            goto LAB_0031eb88;
          }
          if (bVar2 == 5) {
            puVar4 = ((CordRepBtree *)rep)->edges_[0]->storage +
                     (long)(this->edges_[0]->storage + -0x1a);
            sVar5 = (((CordRepBtree *)rep)->super_CordRep).length;
            goto LAB_0031eb6e;
          }
          bVar3 = true;
        }
        else {
          if ((bVar2 - 0xf9 < 7) || (bVar2 < 6)) goto LAB_0031eba6;
          sVar5 = (((CordRepBtree *)rep)->super_CordRep).length;
          puVar4 = ((CordRepBtree *)rep)->edges_[0]->storage + (long)&this->super_CordRep;
LAB_0031eb6e:
          fragment->_M_len = sVar5;
          fragment->_M_str = (char *)puVar4;
          this = (CordRepBtree *)0x1;
LAB_0031eb88:
          bVar3 = false;
        }
        bVar2 = (byte)this;
        if (!bVar3) goto LAB_0031eb00;
      }
      else {
        if (bVar2 == 3) {
          bVar3 = cord_internal::CordRepBtree::IsFlat((CordRepBtree *)rep,fragment);
          return bVar3;
        }
        if (bVar2 == 5) {
          pCVar1 = ((CordRepBtree *)rep)->edges_[0];
          fragment->_M_len = (((CordRepBtree *)rep)->super_CordRep).length;
          fragment->_M_str = (char *)pCVar1;
          goto LAB_0031eafe;
        }
      }
      bVar2 = 0;
      goto LAB_0031eb00;
    }
    if ((bVar2 - 0xf9 < 7) || (bVar2 < 6)) {
LAB_0031eba6:
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
    }
    fragment->_M_len = (((CordRepBtree *)rep)->super_CordRep).length;
    fragment->_M_str = (char *)(((CordRepBtree *)rep)->super_CordRep).storage;
  }
LAB_0031eafe:
  bVar2 = 1;
LAB_0031eb00:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Cord::GetFlatAux(absl::Nonnull<CordRep*> rep,
                                   absl::Nonnull<absl::string_view*> fragment) {
  assert(rep != nullptr);
  if (rep->length == 0) {
    *fragment = absl::string_view();
    return true;
  }
  rep = cord_internal::SkipCrcNode(rep);
  if (rep->IsFlat()) {
    *fragment = absl::string_view(rep->flat()->Data(), rep->length);
    return true;
  } else if (rep->IsExternal()) {
    *fragment = absl::string_view(rep->external()->base, rep->length);
    return true;
  } else if (rep->IsBtree()) {
    return rep->btree()->IsFlat(fragment);
  } else if (rep->IsSubstring()) {
    CordRep* child = rep->substring()->child;
    if (child->IsFlat()) {
      *fragment = absl::string_view(
          child->flat()->Data() + rep->substring()->start, rep->length);
      return true;
    } else if (child->IsExternal()) {
      *fragment = absl::string_view(
          child->external()->base + rep->substring()->start, rep->length);
      return true;
    } else if (child->IsBtree()) {
      return child->btree()->IsFlat(rep->substring()->start, rep->length,
                                    fragment);
    }
  }
  return false;
}